

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 int64_to_float64_scalbn_arm(int64_t a,int scale,float_status *status)

{
  FloatParts FVar1;
  
  FVar1 = int_to_float(a,scale,status);
  FVar1 = round_canonical(FVar1,status,&float64_params);
  return FVar1.frac & 0xfffffffffffff | (ulong)(FVar1.exp & 0x7ff) << 0x34 |
         (FVar1._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

float64 int64_to_float64_scalbn(int64_t a, int scale, float_status *status)
{
    FloatParts pa = int_to_float(a, scale, status);
    return float64_round_pack_canonical(pa, status);
}